

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void free_macro_call(macro_call_t mc)

{
  VARR_token_t *__ptr;
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  ulong *puVar4;
  FILE *__stream;
  uint uVar5;
  macro_call_t pmVar6;
  macro_call_t pmVar7;
  ulong uVar8;
  VARR_token_arr_t *pVVar9;
  size_t *psVar10;
  
  __ptr = mc->repl_buffer;
  pmVar7 = mc;
  if ((__ptr == (VARR_token_t *)0x0) ||
     (pmVar7 = (macro_call_t)__ptr->varr, pmVar7 == (macro_call_t)0x0)) {
LAB_0017a5e6:
    free_macro_call_cold_5();
  }
  else {
    free(pmVar7);
    free(__ptr);
    mc->repl_buffer = (VARR_token_t *)0x0;
    pVVar9 = mc->args;
    if (pVVar9 == (VARR_token_arr_t *)0x0) {
LAB_0017a5cd:
      free(mc);
      return;
    }
    do {
      sVar1 = pVVar9->els_num;
      pmVar7 = (macro_call_t)pVVar9->varr;
      pmVar6 = pmVar7;
      if (sVar1 == 0) goto LAB_0017a5bb;
      if (pmVar7 == (macro_call_t)0x0) {
LAB_0017a5e1:
        free_macro_call_cold_3();
        goto LAB_0017a5e6;
      }
      pVVar9->els_num = sVar1 - 1;
      pmVar6 = *(macro_call_t *)((long)pmVar7 + sVar1 * 8 + -8);
      if ((pmVar6 == (macro_call_t)0x0) ||
         (pmVar7 = *(macro_call_t *)&(pmVar6->pos).lno, pmVar7 == (macro_call_t)0x0)) {
        free_macro_call_cold_2();
        goto LAB_0017a5e1;
      }
      free(pmVar7);
      free(pmVar6);
      pVVar9 = mc->args;
    } while (pVVar9 != (VARR_token_arr_t *)0x0);
    free_macro_call_cold_1();
LAB_0017a5bb:
    pmVar7 = pmVar6;
    if (pmVar6 != (macro_call_t)0x0) {
      free(pmVar6);
      free(pVVar9);
      goto LAB_0017a5cd;
    }
  }
  free_macro_call_cold_4();
  if (pmVar7 != (macro_call_t)0x0) {
    return;
  }
  VARR_token_arr_tlength_cold_1();
  pVVar9 = pmVar7->args;
  pmVar6 = pmVar7;
  if ((pVVar9 != (VARR_token_arr_t *)0x0) &&
     (pmVar6 = (macro_call_t)pVVar9->varr, pmVar6 != (macro_call_t)0x0)) {
    free(pmVar6);
    free(pVVar9);
    free(pmVar7);
    return;
  }
  free_stream_cold_1();
  if (pmVar6 != (macro_call_t)0x0) {
    return;
  }
  VARR_stream_tlength_cold_1();
  if (((pmVar6 != (macro_call_t)0x0) &&
      (lVar2._0_4_ = (pmVar6->pos).lno, lVar2._4_4_ = (pmVar6->pos).ln_pos, lVar2 != 0)) &&
     (pmVar6->macro != (macro_t)0x0)) {
    pmVar6->macro = (macro_t)&pmVar6->macro[-1].field_0x1f;
    return;
  }
  VARR_stream_tpop_cold_1();
  pmVar7 = pmVar6;
  if (pmVar6->repl_buffer != (VARR_token_t *)0x0) {
    if (pmVar6[1].macro == (macro_t)0x0) goto LAB_0017a715;
    uVar5 = *(uint *)&(pmVar6->pos).fname;
    if (uVar5 != 0) {
      uVar3._0_4_ = (pmVar6->pos).lno;
      uVar3._4_4_ = (pmVar6->pos).ln_pos;
      uVar8 = 0;
      psVar10 = &(pmVar6[1].macro)->replacement->size;
      do {
        if ((int)((VARR_token_t *)(psVar10 + -1))->els_num != 0) {
          pmVar7 = (macro_call_t)*psVar10;
          (*(code *)pmVar6->repl_buffer)(pmVar7,uVar3);
          uVar5 = *(uint *)&(pmVar6->pos).fname;
        }
        uVar8 = uVar8 + 1;
        psVar10 = psVar10 + 2;
      } while (uVar8 < uVar5);
    }
  }
  *(undefined4 *)&(pmVar6->pos).fname = 0;
  pmVar6->macro = (macro_t)0x0;
  puVar4 = (ulong *)pmVar6[1].pos.fname;
  if (puVar4 != (ulong *)0x0) {
    if ((int)*puVar4 != 0) {
      memset((void *)puVar4[2],0xff,(*puVar4 & 0xffffffff) << 2);
      return;
    }
    return;
  }
  HTAB_case_t_clear_cold_2();
LAB_0017a715:
  HTAB_case_t_clear_cold_1();
  __stream = *(FILE **)(pmVar7->pos).fname;
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s\n");
  }
  longjmp((__jmp_buf_tag *)&(pmVar7->pos).lno,1);
}

Assistant:

static void free_macro_call (macro_call_t mc) {
  VARR_DESTROY (token_t, mc->repl_buffer);
  if (mc->args != NULL) {
    while (VARR_LENGTH (token_arr_t, mc->args) != 0) {
      VARR (token_t) *arg = VARR_POP (token_arr_t, mc->args);
      VARR_DESTROY (token_t, arg);
    }
    VARR_DESTROY (token_arr_t, mc->args);
  }
  free (mc);
}